

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

function<void_(TcpSocket_*,_void_*)> * __thiscall
SslTcpSocketImpl::BindFuncConEstablished
          (function<void_(TcpSocket_*,_void_*)> *__return_storage_ptr__,SslTcpSocketImpl *this,
          function<void_(TcpSocket_*,_void_*)> *fClientConnected)

{
  std::function<void_(TcpSocket_*,_void_*)>::swap(&this->m_fClientConnectedParam,fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::function(__return_storage_ptr__,fClientConnected);
  return __return_storage_ptr__;
}

Assistant:

function<void(TcpSocket*, void*)> SslTcpSocketImpl::BindFuncConEstablished(function<void(TcpSocket*, void*)> fClientConnected) noexcept
{
    m_fClientConnectedParam.swap(fClientConnected);
    return fClientConnected;
}